

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O2

void __thiscall
TPZSYsmpMatrix<double>::AutoFill
          (TPZSYsmpMatrix<double> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  int iVar1;
  double *pdVar2;
  _Rb_tree_node_base *p_Var3;
  set<long,_std::less<long>,_std::allocator<long>_> *psVar4;
  long row;
  _Self __tmp;
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_> eqs;
  TPZVec<long> IA;
  TPZStack<long,_10> JA;
  TPZStack<double,_10> A;
  TPZFMatrix<double> orig;
  long local_208;
  long local_200;
  TPZSYsmpMatrix<double> *local_1f8;
  int64_t local_1f0;
  long local_1e8;
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_> local_1e0;
  TPZVec<long> local_1c0;
  TPZManVector<long,_10> local_1a0;
  TPZManVector<double,_10> local_130;
  TPZFMatrix<double> local_c0;
  
  if (nrow != ncol || symmetric == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzsysmp.cpp"
               ,0x120);
  }
  TPZFMatrix<double>::TPZFMatrix(&local_c0);
  TPZMatrix<double>::AutoFill(&local_c0.super_TPZMatrix<double>,nrow,ncol,symmetric);
  TPZVec<long>::TPZVec(&local_1c0,nrow + 1);
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_1a0);
  TPZStack<double,_10>::TPZStack((TPZStack<double,_10> *)&local_130);
  *local_1c0.fStore = 0;
  local_1f8 = this;
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::TPZVec(&local_1e0,nrow);
  for (local_200 = 0; local_200 < nrow; local_200 = local_200 + 1) {
    std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               (local_1e0.fStore + local_200),&local_200);
    for (local_208 = 0; local_208 < ncol; local_208 = local_208 + 1) {
      iVar1 = rand();
      if (0.5 < (double)iVar1 / 2147483647.0) {
        std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   (local_1e0.fStore + local_200),&local_208);
        if (symmetric != 0) {
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)(local_1e0.fStore + local_208),&local_200);
        }
      }
    }
  }
  row = 0;
  local_1e8 = 0;
  if (0 < nrow) {
    local_1e8 = nrow;
  }
  local_1f0 = nrow;
  for (; row != local_1e8; row = row + 1) {
    psVar4 = local_1e0.fStore;
    for (p_Var3 = local_1e0.fStore[row]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &psVar4[row]._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if (row <= *(long *)(p_Var3 + 1)) {
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_1a0,*(long *)(p_Var3 + 1));
        pdVar2 = TPZFMatrix<double>::operator()(&local_c0,row,*(int64_t *)(p_Var3 + 1));
        TPZStack<double,_10>::Push((TPZStack<double,_10> *)&local_130,*pdVar2);
        psVar4 = local_1e0.fStore;
      }
    }
    local_1c0.fStore[row + 1] = local_1a0.super_TPZVec<long>.fNElements;
  }
  (local_1f8->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = local_1f0;
  (local_1f8->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = ncol;
  (*(local_1f8->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4f]
  )(local_1f8,&local_1c0,&local_1a0,&local_130);
  TPZVec<std::set<long,_std::less<long>,_std::allocator<long>_>_>::~TPZVec(&local_1e0);
  TPZManVector<double,_10>::~TPZManVector(&local_130);
  TPZManVector<long,_10>::~TPZManVector(&local_1a0);
  TPZVec<long>::~TPZVec(&local_1c0);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZSYsmpMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric)
{
    if (!symmetric || nrow != ncol) {
        DebugStop();
    }
    TPZFMatrix<TVar> orig;
    orig.AutoFill(nrow,ncol,symmetric);
    
    TPZVec<int64_t> IA(nrow+1);
    TPZStack<int64_t> JA;
    TPZStack<TVar> A;
    IA[0] = 0;
    TPZVec<std::set<int64_t> > eqs(nrow);
    for (int64_t row=0; row<nrow; row++) {
        eqs[row].insert(row);
        for (int64_t col = 0; col<ncol; col++) {
            REAL test = rand()*1./RAND_MAX;
            if (test > 0.5) {
                eqs[row].insert(col);
                if (symmetric) {
                    eqs[col].insert(row);
                }
            }
        }
    }
    int64_t pos=0;
    for (int64_t row=0; row< nrow; row++) {
        for (std::set<int64_t>::iterator col = eqs[row].begin(); col != eqs[row].end(); col++) {
            if(*col >= row)
            {
                JA.Push(*col);
                A.Push(orig(row,*col));
            }
        }
        IA[row+1] = JA.size();
    }
    TPZMatrix<TVar>::Resize(nrow,ncol);
    SetData(IA, JA, A);
}